

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

time_point __thiscall ztimer::TimerManager::Str2Time(TimerManager *this,string *timePoint)

{
  time_t tVar1;
  duration dVar2;
  vector<int,_std::allocator<int>_> futureTime;
  _Vector_base<int,_std::allocator<int>_> local_60;
  tm local_48;
  
  TimePointValid((vector<int,_std::allocator<int>_> *)&local_60,(TimerManager *)timePoint,timePoint)
  ;
  if (local_60._M_impl.super__Vector_impl_data._M_start ==
      local_60._M_impl.super__Vector_impl_data._M_finish) {
    dVar2.__r = 0;
  }
  else {
    local_48.tm_mon =
         (int)((ulong)*(undefined8 *)local_60._M_impl.super__Vector_impl_data._M_start >> 0x20) + -1
    ;
    local_48.tm_year =
         (int)*(undefined8 *)local_60._M_impl.super__Vector_impl_data._M_start + -0x76c;
    local_48.tm_mday = local_60._M_impl.super__Vector_impl_data._M_start[2];
    local_48.tm_hour = local_60._M_impl.super__Vector_impl_data._M_start[3];
    local_48.tm_min = local_60._M_impl.super__Vector_impl_data._M_start[4];
    local_48.tm_sec = local_60._M_impl.super__Vector_impl_data._M_start[5];
    tVar1 = mktime(&local_48);
    dVar2.__r = tVar1 * 1000000000;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
  return (time_point)(duration)dVar2.__r;
}

Assistant:

std::chrono::system_clock::time_point TimerManager::Str2Time(const std::string& timePoint)
    {
        auto futureTime = TimePointValid(timePoint);
        if (futureTime.empty()) {
            return {};
        }
        std::tm date;
        date.tm_year = futureTime[0] - 1900;
        date.tm_mon = futureTime[1] - 1;
        date.tm_mday = futureTime[2];
        date.tm_hour = futureTime[3];
        date.tm_min = futureTime[4];
        date.tm_sec = futureTime[5];
        return std::chrono::system_clock::from_time_t(std::mktime(&date));
    }